

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

PyTypeObject * pybind11::detail::make_default_metaclass(void)

{
  long lVar1;
  int iVar2;
  PyTypeObject *pPVar3;
  error_already_set *this;
  object name_obj;
  object local_28;
  object local_20;
  
  local_20.super_handle.m_ptr = (handle)PyUnicode_FromString("pybind11_type");
  pPVar3 = (PyTypeObject *)(*_kci)(&PyType_Type,0);
  if (pPVar3 == (PyTypeObject *)0x0) {
    pybind11_fail("make_default_metaclass(): error allocating metaclass!");
  }
  if (local_20.super_handle.m_ptr == (PyObject *)0x0) {
    pPVar3[2].tp_basicsize = 0;
  }
  else {
    lVar1 = *(long *)local_20.super_handle.m_ptr;
    *(long *)local_20.super_handle.m_ptr = lVar1 + 1;
    pPVar3[2].tp_basicsize = (Py_ssize_t)local_20.super_handle.m_ptr;
    *(long *)local_20.super_handle.m_ptr = lVar1 + 2;
  }
  pPVar3[2].tp_dealloc = (destructor)local_20.super_handle.m_ptr;
  pPVar3->tp_name = "pybind11_type";
  _PyType_Type = _PyType_Type + 1;
  pPVar3->tp_base = (_typeobject *)&PyType_Type;
  pPVar3->tp_flags = 0x600;
  pPVar3->tp_call = pybind11_meta_call;
  pPVar3->tp_setattro = pybind11_meta_setattro;
  pPVar3->tp_getattro = pybind11_meta_getattro;
  pPVar3->tp_dealloc = pybind11_meta_dealloc;
  iVar2 = PyType_Ready(pPVar3);
  if (-1 < iVar2) {
    str::str((str *)&local_28,"pybind11_builtins");
    iVar2 = PyObject_SetAttrString(pPVar3,"__module__",local_28.super_handle.m_ptr);
    if (iVar2 == 0) {
      object::~object(&local_28);
      object::~object(&local_20);
      return pPVar3;
    }
    this = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this);
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");
}

Assistant:

inline PyTypeObject* make_default_metaclass() {
    constexpr auto *name = "pybind11_type";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type)
        pybind11_fail("make_default_metaclass(): error allocating metaclass!");

    heap_type->ht_name = name_obj.inc_ref().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyType_Type);
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_call = pybind11_meta_call;

    type->tp_setattro = pybind11_meta_setattro;
#if PY_MAJOR_VERSION >= 3
    type->tp_getattro = pybind11_meta_getattro;
#endif

    type->tp_dealloc = pybind11_meta_dealloc;

    if (PyType_Ready(type) < 0)
        pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    return type;
}